

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.hpp
# Opt level: O1

type __thiscall
boost::spirit::classic::
action<boost::spirit::classic::strlit<char_const*>,DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::SetLastParsedType>
::
parse<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>
          (action<boost::spirit::classic::strlit<char_const*>,DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::SetLastParsedType>
           *this,scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>
                 *scan)

{
  type tVar1;
  iterator_t save;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  local_80;
  
  skipper_iteration_policy<boost::spirit::classic::iteration_policy>::
  at_end<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>
            ((skipper_iteration_policy<boost::spirit::classic::iteration_policy> *)scan,scan);
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&local_80,scan->first);
  tVar1 = strlit<char_const*>::
          parse<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>
                    ((strlit<char_const*> *)this,scan);
  if (-1 < tVar1.len) {
    attributed_action_policy<boost::spirit::classic::nil_t>::
    call<DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::SetLastParsedType,boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>>
              (this + 0x10,&local_80,scan->first);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._pos.
         super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .file._M_dataplus._M_p !=
      &local_80._pos.
       super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .file.field_2) {
    operator_delete(local_80._pos.
                    super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .file._M_dataplus._M_p,
                    local_80._pos.
                    super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .file.field_2._M_allocated_capacity + 1);
  }
  detail::shared_count::~shared_count(&local_80._end.super_type.m_iterator.m_mem.pn);
  detail::shared_count::~shared_count
            ((shared_count *)((long)&local_80.super_type.m_iterator.super_type.m_iterator.m_mem + 8)
            );
  return (type)tVar1.len;
}

Assistant:

typename parser_result<self_t, ScannerT>::type
        parse(ScannerT const& scan) const
        {
            typedef typename ScannerT::iterator_t iterator_t;
            typedef typename parser_result<self_t, ScannerT>::type result_t;

            scan.at_end(); // allow skipper to take effect
            iterator_t save = scan.first;
            result_t hit = this->subject().parse(scan);
            if (hit)
            {
                typename result_t::return_t val = hit.value();
                scan.do_action(actor, val, save, scan.first);
            }
            return hit;
        }